

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

char * auth_digest_string_quoted(char *source)

{
  char *pcVar1;
  char *local_30;
  char *d;
  size_t n;
  char *s;
  char *dest;
  char *source_local;
  
  d = (char *)0x1;
  for (n = (size_t)source; *(char *)n != '\0'; n = n + 1) {
    if ((*(char *)n == '\"') || (pcVar1 = d + 1, *(char *)n == '\\')) {
      pcVar1 = d + 2;
    }
    d = pcVar1;
  }
  pcVar1 = (char *)(*Curl_cmalloc)((size_t)d);
  local_30 = pcVar1;
  n = (size_t)source;
  if (pcVar1 != (char *)0x0) {
    while (*(char *)n != '\0') {
      if ((*(char *)n == '\"') || (*(char *)n == '\\')) {
        *local_30 = '\\';
        local_30 = local_30 + 1;
      }
      *local_30 = *(char *)n;
      local_30 = local_30 + 1;
      n = n + 1;
    }
    *local_30 = '\0';
  }
  return pcVar1;
}

Assistant:

static char *auth_digest_string_quoted(const char *source)
{
  char *dest;
  const char *s = source;
  size_t n = 1; /* null terminator */

  /* Calculate size needed */
  while(*s) {
    ++n;
    if(*s == '"' || *s == '\\') {
      ++n;
    }
    ++s;
  }

  dest = malloc(n);
  if(dest) {
    char *d = dest;
    s = source;
    while(*s) {
      if(*s == '"' || *s == '\\') {
        *d++ = '\\';
      }
      *d++ = *s++;
    }
    *d = '\0';
  }

  return dest;
}